

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pob-3119-rb.c
# Opt level: O1

int pob_recv_pkt(int sock,rtp_pkt_t *pkt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  timeval t_out;
  fd_set fds;
  timeval local_b8;
  fd_set local_a8;
  
  local_b8.tv_sec = 0;
  local_b8.tv_usec = 20000;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  iVar2 = sock + 0x3f;
  if (-1 < sock) {
    iVar2 = sock;
  }
  uVar4 = 1L << ((byte)(sock % 0x40) & 0x3f);
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[iVar2 >> 6] = local_a8.fds_bits[iVar2 >> 6] | uVar4;
  iVar5 = 0;
  iVar1 = select(sock + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
      perror("select");
      iVar5 = -1;
    }
  }
  else {
    iVar5 = 0;
    if ((local_a8.fds_bits[iVar2 >> 6] & uVar4) != 0) {
      rtp_rfc3119_pkt_init(pkt);
      iVar2 = rtp_pkt_read(pkt,sock);
      iVar5 = (uint)(0 < iVar2) * 2 + -1;
    }
  }
  return iVar5;
}

Assistant:

int pob_recv_pkt(int sock, rtp_pkt_t *pkt) {
  struct timeval t_out;
  t_out.tv_sec  = 0;
  t_out.tv_usec = RTP_MINSLEEP;

  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  /*M
    Wait for network input or for timeout.
  **/
  int ret = select(sock + 1, &fds, NULL, NULL, &t_out);
  
  /*M
    Check for interrupted system call.
  **/
  if (ret == -1) {
    if ((errno == EINTR) || (errno == EAGAIN)) {
      return 0;
    } else {
      perror("select");
      return -1;
    }
  }
  
  /*M
    If there is network input, read incoming packet.
  **/
  if (FD_ISSET(sock, &fds)) {
    rtp_rfc3119_pkt_init(pkt);
    
    if (rtp_pkt_read(pkt, sock) <= 0) {
      return -1;
    } else {
      return 1;
    }
  }

  return 0;
}